

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall iu_AssertionTest_x_iutest_x_NE_Test::Body(iu_AssertionTest_x_iutest_x_NE_Test *this)

{
  bool bVar1;
  char *pcVar2;
  void **in_R9;
  AssertionHelper local_b80;
  Fixed local_b50;
  int *local_9c8;
  undefined1 local_9c0 [8];
  AssertionResult iutest_ar_5;
  Fixed local_968;
  undefined1 local_7e0 [8];
  AssertionResult iutest_ar_4;
  Fixed local_788;
  undefined1 local_600 [8];
  AssertionResult iutest_ar_3;
  int *one;
  Fixed local_5a0;
  undefined1 local_418 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c0;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int x1;
  int x0;
  iu_AssertionTest_x_iutest_x_NE_Test *this_local;
  
  iutest_ar._36_4_ = 0;
  iutest_ar.m_result = true;
  iutest_ar._33_3_ = 0;
  iutest::detail::AlwaysZero();
  iutest::internal::backward::NeHelper<false>::Compare<int>
            ((AssertionResult *)local_40,"x0","x1",(int *)&iutest_ar.field_0x24,
             (int *)&iutest_ar.m_result);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x82,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::internal::backward::NeHelper<false>::Compare<int>
              ((AssertionResult *)local_238,"x0","x1",(int *)&iutest_ar.field_0x24,
               (int *)&iutest_ar.m_result);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x83,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::NeHelper<false>::Compare<int>
              ((AssertionResult *)local_418,"x0","x1",(int *)&iutest_ar.field_0x24,
               (int *)&iutest_ar.m_result);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
    if (!bVar1) {
      memset(&local_5a0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&one,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x84,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&one,&local_5a0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&one);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
    iutest_ar_3.m_result = true;
    iutest_ar_3._33_7_ = 0;
    iutest::detail::AlwaysZero();
    iutest::internal::backward::NeHelper<true>::Compare<int>
              ((AssertionResult *)local_600,"__null","one",(Object *)0x0,(int *)iutest_ar_3._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
    if (!bVar1) {
      memset(&local_788,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_788);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_600);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_4.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x86,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_788);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_788);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      iutest::internal::backward::NeHelper<true>::Compare<int>
                ((AssertionResult *)local_7e0,"nullptr","one",(Object *)0x0,
                 (int *)iutest_ar_3._32_8_);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
      if (!bVar1) {
        memset(&local_968,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_968);
        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7e0);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_5.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                   ,0x89,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_968);
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_968);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
      if (iutest_ar_1._36_4_ == 0) {
        iutest::detail::AlwaysZero();
        local_9c8 = (int *)0x0;
        iutest::internal::backward::NeHelper<false>::Compare<int*,decltype(nullptr)>
                  ((AssertionResult *)local_9c0,(NeHelper<false> *)"one","nullptr",
                   &iutest_ar_3.m_result,&local_9c8,in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
        if (!bVar1) {
          memset(&local_b50,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_b50);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9c0);
          iutest::AssertionHelper::AssertionHelper
                    (&local_b80,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                     ,0x8a,pcVar2,kFatalFailure);
          iutest::AssertionHelper::operator=(&local_b80,&local_b50);
          iutest::AssertionHelper::~AssertionHelper(&local_b80);
          iutest::AssertionHelper::Fixed::~Fixed(&local_b50);
        }
        iutest_ar_1._37_3_ = 0;
        iutest_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
      }
    }
  }
  return;
}

Assistant:

IUTEST(AssertionTest, NE)
{
    int x0=0, x1=1;
    IUTEST_ASSERT_NE(x0, x1);
    IUTEST_EXPECT_NE(x0, x1);
    IUTEST_INFORM_NE(x0, x1);
    int* one=reinterpret_cast<int*>(1);
    IUTEST_ASSERT_NE(NULL, one);

#if IUTEST_HAS_NULLPTR
    IUTEST_ASSERT_NE(nullptr, one);
    IUTEST_ASSERT_NE(one, nullptr);
#endif
}